

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O3

void __thiscall
stored_flag_reader<setup::header::flags_Enum_>::add
          (stored_flag_reader<setup::header::flags_Enum_> *this,enum_type flag)

{
  uint uVar1;
  size_t sVar2;
  char buffer [1];
  byte local_19;
  
  sVar2 = this->pos;
  if (sVar2 == 0) {
    this->bytes = this->bytes + 1;
    std::istream::read((char *)this->stream,(long)&local_19);
    this->buffer = local_19;
    sVar2 = this->pos;
  }
  else {
    local_19 = this->buffer;
  }
  uVar1 = (uint)sVar2;
  if ((local_19 >> (uVar1 & 0x1f) & 1) != 0) {
    flags<setup::header::flags_Enum_,_65UL>::operator|=(&this->result,flag);
    uVar1 = (uint)this->pos;
  }
  this->pos = (ulong)(uVar1 + 1 & 7);
  return;
}

Assistant:

void add(enum_type flag) {
		
		if(pos == 0) {
			bytes++;
			buffer = util::load<stored_type>(stream);
		}
		
		if(buffer & (stored_type(1) << pos)) {
			result |= flag;
		}
		
		pos = (pos + 1) % stored_bits;
	}